

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedReceive>
::reject(AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedReceive>
         *this,Exception *exception)

{
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> EStack_1a8;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&EStack_1a8,exception);
    EStack_1a8.value.ptr.isSet = false;
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              (&this->result,&EStack_1a8);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    ~ExceptionOr(&EStack_1a8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }